

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

uint64_t mpack_node_u64(mpack_node_t node)

{
  mpack_tree_t *pmVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar1 = node.tree;
  pmVar2 = node.data;
  if (pmVar1->error == mpack_ok) {
    if (pmVar2->type == mpack_type_int) {
      if (-1 < (pmVar2->value).i) {
        return (pmVar2->value).i;
      }
    }
    else if (pmVar2->type == mpack_type_uint) {
      return (uint64_t)(pmVar2->value).d;
    }
    pmVar1->error = mpack_error_type;
    if (pmVar1->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar1->error_fn)(pmVar1,mpack_error_type);
      return 0;
    }
  }
  return 0;
}

Assistant:

MPACK_INLINE uint64_t mpack_node_u64(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        return node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0)
            return (uint64_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}